

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

void Curl_freeset(Curl_easy *data)

{
  uint local_18;
  uint local_14;
  dupblob j;
  dupstring i;
  Curl_easy *data_local;
  
  for (local_14 = 0; local_14 < 0x4f; local_14 = local_14 + 1) {
    (*Curl_cfree)((data->set).str[local_14]);
    (data->set).str[local_14] = (char *)0x0;
  }
  for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
    (*Curl_cfree)((data->set).blobs[local_18]);
    (data->set).blobs[local_18] = (curl_blob *)0x0;
  }
  if ((*(uint *)&(data->state).field_0x6d0 >> 0x12 & 1) != 0) {
    (*Curl_cfree)((data->state).referer);
    (data->state).referer = (char *)0x0;
    *(uint *)&(data->state).field_0x6d0 = *(uint *)&(data->state).field_0x6d0 & 0xfffbffff;
  }
  (data->state).referer = (char *)0x0;
  if ((*(uint *)&(data->state).field_0x6d0 >> 0x11 & 1) != 0) {
    (*Curl_cfree)((data->state).url);
    (data->state).url = (char *)0x0;
    *(uint *)&(data->state).field_0x6d0 = *(uint *)&(data->state).field_0x6d0 & 0xfffdffff;
  }
  (data->state).url = (char *)0x0;
  Curl_mime_cleanpart(&(data->set).mimepost);
  return;
}

Assistant:

void Curl_freeset(struct Curl_easy *data)
{
  /* Free all dynamic strings stored in the data->set substructure. */
  enum dupstring i;
  enum dupblob j;

  for(i = (enum dupstring)0; i < STRING_LAST; i++) {
    Curl_safefree(data->set.str[i]);
  }

  for(j = (enum dupblob)0; j < BLOB_LAST; j++) {
    Curl_safefree(data->set.blobs[j]);
  }

  if(data->state.referer_alloc) {
    Curl_safefree(data->state.referer);
    data->state.referer_alloc = FALSE;
  }
  data->state.referer = NULL;
  if(data->state.url_alloc) {
    Curl_safefree(data->state.url);
    data->state.url_alloc = FALSE;
  }
  data->state.url = NULL;

  Curl_mime_cleanpart(&data->set.mimepost);
}